

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O3

void ssw_writerecord(mcpl_generic_wfilehandle_t *fh,int reclen,size_t lbuf,char *buf)

{
  undefined8 uVar1;
  size_t *psVar2;
  uint32_t rl;
  uint64_t rl_1;
  undefined4 local_2c;
  size_t local_28;
  
  if (reclen == 4) {
    if (lbuf >> 0x20 != 0) {
      ssw_error("output record size too large for 32bit records");
    }
    psVar2 = (size_t *)&local_2c;
    local_2c = (undefined4)lbuf;
    mcpl_generic_fwrite(fh,psVar2,4);
    mcpl_generic_fwrite(fh,buf,lbuf);
    uVar1 = 4;
  }
  else {
    psVar2 = &local_28;
    local_28 = lbuf;
    mcpl_generic_fwrite(fh,psVar2,8);
    mcpl_generic_fwrite(fh,buf,lbuf);
    uVar1 = 8;
  }
  mcpl_generic_fwrite(fh,psVar2,uVar1);
  return;
}

Assistant:

void ssw_writerecord( mcpl_generic_wfilehandle_t* fh,
                      int reclen, size_t lbuf, char* buf )
{
  if (reclen==4) {
    if ( lbuf > UINT32_MAX )
      ssw_error("output record size too large for 32bit records");
    uint32_t rl = (uint32_t)lbuf;
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
    mcpl_generic_fwrite( fh, buf, lbuf );
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
  } else {
    assert(reclen==8);
    uint64_t rl = lbuf;
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
    mcpl_generic_fwrite( fh, buf, lbuf );
    mcpl_generic_fwrite( fh, (char*)&rl, sizeof(rl) );
  }
}